

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O3

void PatchRandoWorldEdits::alter_palettes_for_miscolored_ground_items(World *world)

{
  pointer ppEVar1;
  mapped_type *ppMVar2;
  ulong uVar3;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *this;
  uint8_t i;
  ulong uVar4;
  key_type local_20 [4];
  
  this = &world->_maps;
  uVar4 = 2;
  do {
    local_20[0] = 0x234;
    ppMVar2 = std::
              map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
              ::at(this,local_20);
    ppEVar1 = ((*ppMVar2)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)((*ppMVar2)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3;
    if (uVar3 <= uVar4) goto LAB_001635f4;
    (ppEVar1[uVar4]->_attrs).palette = '\0';
    uVar4 = uVar4 + 1;
  } while (uVar4 != 6);
  local_20[2] = 0x234;
  ppMVar2 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this,local_20 + 2);
  ppEVar1 = ((*ppMVar2)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((*ppMVar2)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar1) {
    ((*ppEVar1)->_attrs).palette = '\x01';
    local_20[3] = 0x19f;
    ppMVar2 = std::
              map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
              ::at(this,local_20 + 3);
    ppEVar1 = ((*ppMVar2)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (((*ppMVar2)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppEVar1) {
      ((*ppEVar1)->_attrs).palette = '\0';
      uVar4 = 1;
      while( true ) {
        local_20[1] = 0x19f;
        ppMVar2 = std::
                  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
                  ::at(this,local_20 + 1);
        ppEVar1 = ((*ppMVar2)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar3 = (long)((*ppMVar2)->_entities).
                      super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3;
        if (uVar3 <= uVar4) break;
        (ppEVar1[uVar4]->_attrs).palette = '\x01';
        uVar4 = uVar4 + 1;
        if (uVar4 == 3) {
          return;
        }
      }
      goto LAB_001635f4;
    }
  }
  uVar4 = 0;
  uVar3 = 0;
LAB_001635f4:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4,uVar3
            );
}

Assistant:

static void alter_palettes_for_miscolored_ground_items(World& world)
    {
        // Force trees to use environmental palette
        for(uint8_t i=2 ; i<=5 ; ++i)
            world.map(MAP_GREENMAZE_SUNSTONE)->entities().at(i)->palette(0);
        // Put item back on its appropriate palette
        world.map(MAP_GREENMAZE_SUNSTONE)->entities().at(0)->palette(1);

        // Force tree to use environmental palette
        world.map(MAP_KN_LABYRINTH_TREE_LOGS)->entities().at(0)->palette(0);
        // Put items back on their appropriate palette
        for(uint8_t i=1 ; i<=2 ; ++i)
            world.map(MAP_KN_LABYRINTH_TREE_LOGS)->entities().at(i)->palette(1);
    }